

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::initCase
          (GeometryShader_gl_in_ArrayLengthTest *this,Case *info,GLenum draw_call_mode,
          GLint draw_call_n_vertices,GLint expected_array_length,GLenum tf_mode,
          GLchar *input_body_part,GLchar *output_body_part)

{
  info->draw_call_mode = 0;
  info->draw_call_n_vertices = 0;
  info->tf_mode = 0;
  info->fs_id = 0;
  *(undefined8 *)&info->gs_id = 0;
  info->input_body_part = (GLchar *)0x0;
  info->output_body_part = (GLchar *)0x0;
  info->po_id = 0;
  info->vs_id = 0;
  *(undefined8 *)&info->expected_array_length = 0;
  info->draw_call_mode = draw_call_mode;
  info->draw_call_n_vertices = draw_call_n_vertices;
  info->expected_array_length = expected_array_length;
  info->input_body_part = input_body_part;
  info->output_body_part = output_body_part;
  info->tf_mode = tf_mode;
  return;
}

Assistant:

void GeometryShader_gl_in_ArrayLengthTest::initCase(Case& info, glw::GLenum draw_call_mode,
													glw::GLint draw_call_n_vertices, glw::GLint expected_array_length,
													glw::GLenum tf_mode, const glw::GLchar* input_body_part,
													const glw::GLchar* output_body_part)
{
	/* Reset case descriptor */
	resetCase(info);

	/* Set fields */
	info.draw_call_mode		   = draw_call_mode;
	info.draw_call_n_vertices  = draw_call_n_vertices;
	info.expected_array_length = expected_array_length;
	info.input_body_part	   = input_body_part;
	info.output_body_part	  = output_body_part;
	info.tf_mode			   = tf_mode;
}